

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setSelection(QLabel *this,int start,int length)

{
  QLabelPrivate *pQVar1;
  int in_EDX;
  MoveMode in_ESI;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  QLabelPrivate *d;
  QTextCursor cursor;
  QLabelPrivate *in_stack_00000028;
  undefined1 *local_10;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QLabel *)0x5afedd);
  if (pQVar1->control != (QWidgetTextControl *)0x0) {
    QLabelPrivate::ensureTextPopulated(in_stack_00000028);
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::textCursor(in_RDI);
    QTextCursor::setPosition((int)&local_10,in_ESI);
    QTextCursor::setPosition((int)&local_10,in_ESI + in_EDX);
    QWidgetTextControl::setTextCursor
              ((QWidgetTextControl *)CONCAT44(start,length),(QTextCursor *)d,
               SUB81((ulong)lVar2 >> 0x38,0));
    QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setSelection(int start, int length)
{
    Q_D(QLabel);
    if (d->control) {
        d->ensureTextPopulated();
        QTextCursor cursor = d->control->textCursor();
        cursor.setPosition(start);
        cursor.setPosition(start + length, QTextCursor::KeepAnchor);
        d->control->setTextCursor(cursor);
    }
}